

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::ld_r_r<(SM83::Registers)2,(SM83::Registers)2>(SM83 *this)

{
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_char,_char>
  fmt;
  char *in_stack_ffffffffffffffe8;
  char local_a [2];
  
  local_a[1] = 0x42;
  local_a[0] = 'B';
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x47;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,char,char>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  LD {}, {}\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,(unsigned_short *)(local_a + 1),local_a,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void SM83::ld_r_r() {
    LTRACE("LD {}, {}", Get8bitRegisterName<DestRegister>(), Get8bitRegisterName<SrcRegister>());

    u8* dest = Get8bitRegisterPointer<DestRegister>();
    *dest = Get8bitRegister<SrcRegister>();
}